

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019c8e0 = 0x2d2d2d2d2d2d2d;
    uRam000000000019c8e7._0_1_ = '-';
    uRam000000000019c8e7._1_1_ = '-';
    uRam000000000019c8e7._2_1_ = '-';
    uRam000000000019c8e7._3_1_ = '-';
    uRam000000000019c8e7._4_1_ = '-';
    uRam000000000019c8e7._5_1_ = '-';
    uRam000000000019c8e7._6_1_ = '-';
    uRam000000000019c8e7._7_1_ = '-';
    DAT_0019c8d0 = '-';
    DAT_0019c8d0_1._0_1_ = '-';
    DAT_0019c8d0_1._1_1_ = '-';
    DAT_0019c8d0_1._2_1_ = '-';
    DAT_0019c8d0_1._3_1_ = '-';
    DAT_0019c8d0_1._4_1_ = '-';
    DAT_0019c8d0_1._5_1_ = '-';
    DAT_0019c8d0_1._6_1_ = '-';
    uRam000000000019c8d8 = 0x2d2d2d2d2d2d2d;
    DAT_0019c8df = 0x2d;
    DAT_0019c8c0 = '-';
    DAT_0019c8c0_1._0_1_ = '-';
    DAT_0019c8c0_1._1_1_ = '-';
    DAT_0019c8c0_1._2_1_ = '-';
    DAT_0019c8c0_1._3_1_ = '-';
    DAT_0019c8c0_1._4_1_ = '-';
    DAT_0019c8c0_1._5_1_ = '-';
    DAT_0019c8c0_1._6_1_ = '-';
    uRam000000000019c8c8._0_1_ = '-';
    uRam000000000019c8c8._1_1_ = '-';
    uRam000000000019c8c8._2_1_ = '-';
    uRam000000000019c8c8._3_1_ = '-';
    uRam000000000019c8c8._4_1_ = '-';
    uRam000000000019c8c8._5_1_ = '-';
    uRam000000000019c8c8._6_1_ = '-';
    uRam000000000019c8c8._7_1_ = '-';
    DAT_0019c8b0 = '-';
    DAT_0019c8b0_1._0_1_ = '-';
    DAT_0019c8b0_1._1_1_ = '-';
    DAT_0019c8b0_1._2_1_ = '-';
    DAT_0019c8b0_1._3_1_ = '-';
    DAT_0019c8b0_1._4_1_ = '-';
    DAT_0019c8b0_1._5_1_ = '-';
    DAT_0019c8b0_1._6_1_ = '-';
    uRam000000000019c8b8._0_1_ = '-';
    uRam000000000019c8b8._1_1_ = '-';
    uRam000000000019c8b8._2_1_ = '-';
    uRam000000000019c8b8._3_1_ = '-';
    uRam000000000019c8b8._4_1_ = '-';
    uRam000000000019c8b8._5_1_ = '-';
    uRam000000000019c8b8._6_1_ = '-';
    uRam000000000019c8b8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019c8a8._0_1_ = '-';
    uRam000000000019c8a8._1_1_ = '-';
    uRam000000000019c8a8._2_1_ = '-';
    uRam000000000019c8a8._3_1_ = '-';
    uRam000000000019c8a8._4_1_ = '-';
    uRam000000000019c8a8._5_1_ = '-';
    uRam000000000019c8a8._6_1_ = '-';
    uRam000000000019c8a8._7_1_ = '-';
    DAT_0019c8ef = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}